

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkSplitSop(Abc_Ntk_t *pNtk,int nCubesMax,int fVerbose)

{
  char cVar1;
  Abc_Obj_t *pObj;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *__ptr;
  Abc_Obj_t *pObj_00;
  char *pcVar7;
  Abc_Obj_t *pFanin;
  char *pSop;
  int nVars;
  long lVar8;
  long lVar9;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pNtkNew = (Abc_Ntk_t *)0x0;
  }
  else {
    if ((pNtk->ntkType | ABC_NTK_LOGIC) == ABC_NTK_STRASH) {
      __assert_fail("!Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                    ,0xaeb,"Abc_Ntk_t *Abc_NtkSplitSop(Abc_Ntk_t *, int, int)");
    }
    pNtkNew = Abc_NtkStartFrom(pNtk,pNtk->ntkType,pNtk->ntkFunc);
    __ptr = Abc_NtkDfs(pNtk,0);
    if (0 < __ptr->nSize) {
      lVar8 = 0;
      do {
        pObj = (Abc_Obj_t *)__ptr->pArray[lVar8];
        if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
          __assert_fail("Abc_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcUtil.c"
                        ,0xaf2,"Abc_Ntk_t *Abc_NtkSplitSop(Abc_Ntk_t *, int, int)");
        }
        pObj_00 = Abc_NtkDupObj(pNtkNew,pObj,0);
        iVar3 = Abc_SopGetCubeNum((char *)(pObj->field_5).pData);
        if (nCubesMax < iVar3) {
          nVars = (uint)(0 < iVar3 % nCubesMax) + iVar3 / nCubesMax;
          pSop = (char *)(pObj_00->field_5).pData;
          pcVar7 = Abc_SopCreateOr((Mem_Flex_t *)pNtkNew->pManFunc,nVars,(int *)0x0);
          (pObj_00->field_5).pData = pcVar7;
          iVar4 = Abc_SopIsComplement(pSop);
          if (iVar4 != 0) {
            Abc_SopComplement(pSop);
            Abc_SopComplement((char *)(pObj_00->field_5).pData);
          }
          aVar2 = pObj->field_5;
          (pObj->field_5).pData = "?";
          if (0 < nVars) {
            iVar4 = 0;
            do {
              pFanin = Abc_NtkDupObj(pNtkNew,pObj,0);
              Abc_ObjAddFanin(pObj_00,pFanin);
              iVar5 = (pObj->vFanins).nSize;
              if (0 < iVar5) {
                lVar9 = 0;
                do {
                  Abc_ObjAddFanin((pObj->field_6).pCopy,
                                  *(Abc_Obj_t **)
                                   ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar9]] +
                                   0x40));
                  lVar9 = lVar9 + 1;
                  iVar5 = (pObj->vFanins).nSize;
                } while (lVar9 < iVar5);
              }
              iVar6 = iVar3 % nCubesMax;
              if (iVar4 < iVar3 / nCubesMax) {
                iVar6 = nCubesMax;
              }
              iVar6 = (iVar5 + 3) * iVar6;
              cVar1 = pSop[iVar6];
              pSop[iVar6] = '\0';
              pcVar7 = Abc_SopRegister((Mem_Flex_t *)pNtkNew->pManFunc,pSop);
              (pFanin->field_5).pData = pcVar7;
              pSop[iVar6] = cVar1;
              iVar4 = iVar4 + 1;
              pSop = pSop + iVar6;
            } while (iVar4 != nVars);
          }
          pObj->field_5 = aVar2;
          (pObj->field_6).pCopy = pObj_00;
        }
        else if (0 < (pObj->vFanins).nSize) {
          lVar9 = 0;
          do {
            Abc_ObjAddFanin((pObj->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar9]] + 0x40)
                           );
            lVar9 = lVar9 + 1;
          } while (lVar9 < (pObj->vFanins).nSize);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    Abc_NtkFinalize(pNtk,pNtkNew);
    iVar3 = Abc_NtkCheck(pNtkNew);
    if (iVar3 == 0) {
      fwrite("Abc_NtkDup(): Network check has failed.\n",0x28,1,_stdout);
    }
    pNtk->pCopy = pNtkNew;
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkSplitSop( Abc_Ntk_t * pNtk, int nCubesMax, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pObjNew, * pObjNewRoot;
    int i, k, j, nCubes, nCubesThis, nSplits;
    char * pSopStr, * pSopStr2, * pTempSop, Symb;
    if ( pNtk == NULL )
        return NULL;
    assert( !Abc_NtkIsStrash(pNtk) && !Abc_NtkIsNetlist(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, pNtk->ntkType, pNtk->ntkFunc );
    // copy the internal nodes
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        assert( Abc_ObjIsNode(pObj) );
        pObjNewRoot = Abc_NtkDupObj( pNtkNew, pObj, 0 );
        nCubes = Abc_SopGetCubeNum( (char *)pObj->pData );
        if ( nCubes <= nCubesMax )
        {            
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
            continue;
        }
        nSplits = (nCubes / nCubesMax) + (int)(nCubes % nCubesMax > 0);
        pSopStr = (char *)pObjNewRoot->pData;
        pObjNewRoot->pData = Abc_SopCreateOr((Mem_Flex_t *)pNtkNew->pManFunc, nSplits, NULL);
        if ( Abc_SopIsComplement(pSopStr) )
        {
            Abc_SopComplement( pSopStr );
            Abc_SopComplement( (char *)pObjNewRoot->pData );
        }
        pTempSop = (char *)pObj->pData; pObj->pData = (char *)"?";
        for ( j = 0; j < nSplits; j++ )
        {
            // clone the node
            pObjNew = Abc_NtkDupObj( pNtkNew, pObj, 0 );
            Abc_ObjAddFanin( pObjNewRoot, pObjNew );
            // get its cubes
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
            // create SOP for this node
            nCubesThis = (j < nCubes / nCubesMax) ? nCubesMax : nCubes % nCubesMax;
            pSopStr2 = pSopStr + (Abc_ObjFaninNum(pObj) + 3) * nCubesThis;
            Symb = *pSopStr2; *pSopStr2 = 0;
            pObjNew->pData = Abc_SopRegister( (Mem_Flex_t *)pNtkNew->pManFunc, pSopStr );
            *pSopStr2 = Symb;
            pSopStr = pSopStr2;
        }
        // update 
        pObj->pData = pTempSop;
        pObj->pCopy = pObjNewRoot;
    }
    Vec_PtrFree( vNodes );
    Abc_NtkFinalize( pNtk, pNtkNew );
    // check correctness
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkDup(): Network check has failed.\n" );
    pNtk->pCopy = pNtkNew;
    return pNtkNew;
}